

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O2

void timer_inc(int n,uint32_t clocks,uint32_t remainder)

{
  ushort uVar1;
  gbabus_t *pgVar2;
  gba_interrupt_t interrupt;
  uint uVar3;
  
  uVar3 = bus->TMINT[n].value + clocks;
switchD_00103d92_default:
  do {
    pgVar2 = bus;
    if (uVar3 < 0x10000) {
      bus->TMINT[n].value = (uint16_t)uVar3;
      pgVar2->TMINT[n].ticks = (uint16_t)remainder;
      return;
    }
    uVar1 = bus->TMCNT_L[n].raw;
    if ((n != 3) && ((~(uint)bus->TMCNT_H[0] & 0x84) == 0)) {
      timer_inc(n + 1,1,0);
    }
    uVar3 = (uVar3 + uVar1) - 0xffff;
    if (((uint)bus->TMCNT_H[n] & 0x40) != 0) goto code_r0x00103d88;
  } while (1 < (uint)n);
  goto LAB_00103d9c;
code_r0x00103d88:
  interrupt = IRQ_TIMER0;
  switch(n) {
  case 1:
    interrupt = IRQ_TIMER1;
  case 0:
    request_interrupt(interrupt);
LAB_00103d9c:
    sound_timer_overflow(apu,n);
    break;
  case 2:
    request_interrupt(IRQ_TIMER2);
    break;
  case 3:
    request_interrupt(IRQ_TIMER3);
  }
  goto switchD_00103d92_default;
}

Assistant:

void timer_inc(int n, word clocks, word remainder) {
    word new_value = bus->TMINT[n].value + clocks;

    while (new_value > 0xFFFF) {
        new_value = bus->TMCNT_L[n].timer_reload + (new_value - 0xFFFF);

        if (n != 3 && bus->TMCNT_H->cascade && bus->TMCNT_H->start) {
            timer_inc(n + 1, 1, 0);
        }

        if (bus->TMCNT_H[n].timer_irq_enable) {
            switch (n) {
                case 0:
                    request_interrupt(IRQ_TIMER0);
                    break;
                case 1:
                    request_interrupt(IRQ_TIMER1);
                    break;
                case 2:
                    request_interrupt(IRQ_TIMER2);
                    break;
                case 3:
                    request_interrupt(IRQ_TIMER3);
                    break;
            }
        }

        if (n == 0 || n == 1) {
            sound_timer_overflow(apu, n);
        }
    }
    bus->TMINT[n].value = new_value;
    bus->TMINT[n].ticks = remainder;
}